

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O1

bool deqp::gls::FboUtil::detectGLESCompatibleContext
               (RenderContext *ctx,int requiredMajor,int requiredMinor)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GLint minorVersion;
  GLint majorVersion;
  undefined8 local_18;
  long lVar3;
  
  iVar2 = (*ctx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_18 = 0;
  (**(code **)(lVar3 + 0x868))(0x821b);
  iVar2 = (**(code **)(lVar3 + 0x800))();
  if (iVar2 != 0) {
    local_18 = CONCAT44(2,(int)local_18);
  }
  (**(code **)(lVar3 + 0x868))(0x821c,&local_18);
  iVar2 = (**(code **)(lVar3 + 0x800))();
  if (iVar2 != 0) {
    local_18 = local_18 & 0xffffffff00000000;
  }
  bVar1 = true;
  if (local_18._4_4_ < 4) {
    bVar1 = requiredMajor <= (int)local_18 && local_18._4_4_ == 3;
  }
  return bVar1;
}

Assistant:

static bool detectGLESCompatibleContext (const RenderContext& ctx, int requiredMajor, int requiredMinor)
{
	const glw::Functions&	gl				= ctx.getFunctions();
	glw::GLint				majorVersion	= 0;
	glw::GLint				minorVersion	= 0;

	// Detect compatible GLES context by querying GL_MAJOR_VERSION.
	// This query does not exist on GLES2 so a failing query implies
	// GLES2 context.

	gl.getIntegerv(GL_MAJOR_VERSION, &majorVersion);
	if (gl.getError() != GL_NO_ERROR)
		majorVersion = 2;

	gl.getIntegerv(GL_MINOR_VERSION, &minorVersion);
	if (gl.getError() != GL_NO_ERROR)
		minorVersion = 0;

	return (majorVersion > requiredMajor) || (majorVersion == requiredMajor && minorVersion >= requiredMinor);
}